

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mediator_unittests.cc
# Opt level: O3

void __thiscall cpp_mediator_send_receive2_Test::TestBody(cpp_mediator_send_receive2_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  response_type actual;
  Message local_30;
  AssertHelper local_28;
  internal local_20 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  int local_c;
  
  local_c = 1000;
  local_30.ss_.ptr_._0_4_ = 1000;
  testing::internal::CmpHelperEQ<int,int>(local_20,"1000","actual",(int *)&local_30,&local_c);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message(&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nolanholden[P]cpp-mediator/tests/mediator_unittests.cc"
               ,0x92,message);
    testing::internal::AssertHelper::operator=(&local_28,&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(cpp_mediator, send_receive2) {
  SendForWithArgs(b, 1000);
  ASSERT_EQ(1000, actual);
}